

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O3

string * __thiscall Search::construct_path_abi_cxx11_(string *__return_storage_ptr__,Search *this)

{
  char cVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  pointer pcVar3;
  char *pcVar4;
  pointer pcVar5;
  shared_ptr<Node> p;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_38 = (this->final).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_30._M_pi =
       (this->final).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
    }
  }
  if ((local_38->parent).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    do {
      this_00 = (local_38->parent).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      peVar2 = (local_38->parent).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_30,
                 &(local_38->parent).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      local_38 = peVar2;
    } while ((peVar2->parent).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
             (element_type *)0x0);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
  pcVar5 = pcVar3 + (__return_storage_ptr__->_M_string_length - 1);
  if (pcVar3 < pcVar5 && __return_storage_ptr__->_M_string_length != 0) {
    do {
      pcVar4 = pcVar3 + 1;
      cVar1 = *pcVar3;
      *pcVar3 = *pcVar5;
      *pcVar5 = cVar1;
      pcVar5 = pcVar5 + -1;
      pcVar3 = pcVar4;
    } while (pcVar4 < pcVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

string Search::construct_path() {
    string path;
    for (auto p = final; p->parent != nullptr; p = p->parent) {
        auto parent = p->parent;
        int delta_x = p->x - parent->x;
        int delta_y = p->y - parent->y;
        if (delta_x == 0 and delta_y == 1) path.push_back('R');
        else if (delta_x == 0 and delta_y == -1) path.push_back('L');
        else if (delta_x == 1 and delta_y == 0) path.push_back('D');
        else path.push_back('U');
    }
    reverse(path.begin(), path.end());
    return path;
}